

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testInit(GLSLContantImmutablityTest *this)

{
  GLuint constant;
  CONSTANTS CVar1;
  GLuint stage;
  STAGES SVar2;
  testCase test_case;
  value_type local_28;
  
  for (CVar1 = GL_ARB_ENHANCED_LAYOUTS; CVar1 != CONSTANTS_MAX; CVar1 = CVar1 + GL_MAX_XFB) {
    for (SVar2 = COMPUTE; SVar2 != STAGE_MAX; SVar2 = SVar2 + VERTEX) {
      local_28.m_stage = SVar2;
      local_28.m_constant = CVar1;
      std::
      vector<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::GLSLContantImmutablityTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_28);
    }
  }
  return;
}

Assistant:

void GLSLContantImmutablityTest::testInit()
{
	for (GLuint constant = 0; constant < CONSTANTS_MAX; ++constant)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (CONSTANTS)constant, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}